

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

size_t mg_parse_multipart(char *buf,size_t buf_len,char *var_name,size_t var_name_len,
                         char *file_name,size_t file_name_len,char **data,size_t *data_len)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  mg_str header;
  mg_str local_40;
  
  if ((((buf_len == 0 || buf == (char *)0x0) ||
       (iVar2 = get_request_len(buf,(int)buf_len), iVar2 == 0)) || (*buf != '-')) ||
     ((buf[1] != '-' || (buf[2] == '\n')))) {
    return 0;
  }
  lVar6 = (long)iVar2;
  sVar3 = 0;
  do {
    sVar4 = sVar3;
    if (buf[sVar3] == '\n') break;
    sVar3 = sVar3 + 1;
    sVar4 = buf_len;
  } while (buf_len != sVar3);
  lVar9 = sVar4 + 1;
  if (buf[sVar4] != '\n') {
    lVar9 = 0;
  }
  *file_name = '\0';
  *var_name = '\0';
  lVar10 = lVar9;
  do {
    pcVar1 = buf + lVar10;
    lVar7 = 0;
    lVar5 = lVar6 - lVar10;
    lVar8 = lVar7;
    if (lVar5 != 0) {
      do {
        lVar8 = lVar7;
        if (pcVar1[lVar7] == '\n') break;
        lVar7 = lVar7 + 1;
        lVar8 = lVar5;
      } while (lVar5 != lVar7);
    }
    if ((pcVar1[lVar8] != '\n') || (lVar8 + 1 == 0)) {
      if (buf_len <= (lVar9 + lVar6) - 2U) {
        return 0;
      }
      pcVar1 = buf + lVar6;
      lVar10 = 0;
      while ((pcVar1[lVar10] != '-' || (iVar2 = bcmp(buf,pcVar1 + lVar10,lVar9 - 2U), iVar2 != 0)))
      {
        lVar8 = lVar10 + 1;
        lVar10 = lVar10 + 1;
        if (buf_len <= lVar8 + lVar6 + (lVar9 - 2U)) {
          return 0;
        }
      }
      if (data_len != (size_t *)0x0) {
        *data_len = lVar10 - 2;
      }
      if (data != (char **)0x0) {
        *data = pcVar1;
        return lVar6 + lVar10;
      }
      return lVar6 + lVar10;
    }
    iVar2 = mg_ncasecmp("Content-Disposition: ",pcVar1,0x15);
    if (iVar2 == 0) {
      local_40.p = pcVar1 + 0x15;
      local_40.len = lVar8 - 0x16;
      mg_http_parse_header(&local_40,"name",var_name,var_name_len);
      mg_http_parse_header(&local_40,"filename",file_name,file_name_len);
    }
    lVar10 = lVar10 + lVar8 + 1;
  } while( true );
}

Assistant:

size_t mg_parse_multipart(const char *buf, size_t buf_len, char *var_name,
                          size_t var_name_len, char *file_name,
                          size_t file_name_len, const char **data,
                          size_t *data_len) {
    static const char cd[] = "Content-Disposition: ";
    size_t hl, bl, n, ll, pos, cdl = sizeof(cd) - 1;

    if (buf == NULL || buf_len <= 0) return 0;
    if ((hl = get_request_len(buf, buf_len)) <= 0) return 0;
    if (buf[0] != '-' || buf[1] != '-' || buf[2] == '\n') return 0;

    /* Get boundary length */
    bl = get_line_len(buf, buf_len);

    /* Loop through headers, fetch variable name and file name */
    var_name[0] = file_name[0] = '\0';
    for (n = bl; (ll = get_line_len(buf + n, hl - n)) > 0; n += ll) {
        if (mg_ncasecmp(cd, buf + n, cdl) == 0) {
            struct mg_str header;
            header.p = buf + n + cdl;
            header.len = ll - (cdl + 2);
            mg_http_parse_header(&header, "name", var_name, var_name_len);
            mg_http_parse_header(&header, "filename", file_name, file_name_len);
        }
    }

    /* Scan through the body, search for terminating boundary */
    for (pos = hl; pos + (bl - 2) < buf_len; pos++) {
        if (buf[pos] == '-' && !memcmp(buf, &buf[pos], bl - 2)) {
            if (data_len != NULL) *data_len = (pos - 2) - hl;
            if (data != NULL) *data = buf + hl;
            return pos;
        }
    }

    return 0;
}